

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.cpp
# Opt level: O1

void __thiscall
Executor::handleVariableCall
          (Executor *this,FunctionCallNode *node,RuntimeVariableAnalyser *variableAnalyser)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Executor executor;
  undefined1 local_250 [560];
  
  peVar1 = (variableAnalyser->value_).super___shared_ptr<ExpressionNode,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  this_00 = (variableAnalyser->value_).
            super___shared_ptr<ExpressionNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  Executor((Executor *)local_250,
           (Context *)
           (variableAnalyser->context_).
           super__Optional_base<std::reference_wrapper<const_Context>,_true,_true>._M_payload.
           super__Optional_payload_base<std::reference_wrapper<const_Context>_>._M_payload);
  (*(peVar1->super_Node)._vptr_Node[2])(peVar1,local_250);
  callValue(this,&node->super_CallNode,&node->name_,(Value *)local_250._8_8_);
  local_250._0_8_ = &PTR__Executor_00157328;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_250 + 0xb0));
  std::ios_base::~ios_base((ios_base *)(local_250 + 0x120));
  std::
  deque<std::unique_ptr<Value,_std::default_delete<Value>_>,_std::allocator<std::unique_ptr<Value,_std::default_delete<Value>_>_>_>
  ::~deque((deque<std::unique_ptr<Value,_std::default_delete<Value>_>,_std::allocator<std::unique_ptr<Value,_std::default_delete<Value>_>_>_>
            *)(local_250 + 0x60));
  std::
  deque<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>_>_>
  ::~deque((deque<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>_>_>
            *)(local_250 + 0x10));
  if ((tuple<Value_*,_std::default_delete<Value>_>)local_250._8_8_ !=
      (_Head_base<0UL,_Value_*,_false>)0x0) {
    (**(code **)(*(long *)local_250._8_8_ + 8))();
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

void Executor::handleVariableCall(const FunctionCallNode& node, const RuntimeVariableAnalyser& variableAnalyser)
{
  const auto value = variableAnalyser.getValue();
  auto executor = Executor{variableAnalyser.getContext()};
  value->accept(executor);

  callValue(node, node.getName(), *executor.getValue());
}